

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conc_heter_queue.h
# Opt level: O3

reentrant_put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
density::
conc_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<65536ul>>::
start_reentrant_emplace<std::__cxx11::string,std::__cxx11::string&>
          (reentrant_put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,
          conc_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<65536ul>>
          *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                *i_construction_params)

{
  conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
  *pcVar1;
  int iVar2;
  reentrant_put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  reentrant_put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar2 == 0) {
    heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<65536ul>>::
    start_reentrant_emplace<std::__cxx11::string,std::__cxx11::string&>
              ((reentrant_put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_68,
               (heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<65536ul>>
                *)(this + 0x28),i_construction_params);
    pcVar1 = local_68.m_queue;
    local_48.m_put_data.m_control_block = (ControlBlock *)local_68.m_put_transaction.m_queue;
    local_48.m_put_data.m_user_storage = local_68.m_put_transaction.m_put_data.m_control_block;
    local_68.m_queue =
         (conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
          *)0x0;
    heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>::
    reentrant_put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~reentrant_put_transaction
              ((reentrant_put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_68);
    local_68.m_put_transaction.m_put_data.m_control_block = local_48.m_put_data.m_control_block;
    local_68.m_put_transaction.m_put_data.m_user_storage = local_48.m_put_data.m_user_storage;
    local_48.m_queue =
         (heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
          *)0x0;
    __return_storage_ptr__->m_queue =
         (conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
          *)this;
    (__return_storage_ptr__->m_put_transaction).m_queue =
         (heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
          *)pcVar1;
    (__return_storage_ptr__->m_put_transaction).m_put_data.m_control_block =
         local_48.m_put_data.m_control_block;
    (__return_storage_ptr__->m_put_transaction).m_put_data.m_user_storage =
         local_48.m_put_data.m_user_storage;
    local_68.m_queue =
         (conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
          *)0x0;
    local_68.m_put_transaction.m_queue =
         (heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
          *)0x0;
    conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>::
    reentrant_put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~reentrant_put_transaction(&local_68);
    heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>::
    reentrant_put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~reentrant_put_transaction(&local_48);
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return __return_storage_ptr__;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

reentrant_put_transaction<ELEMENT_TYPE>
          start_reentrant_emplace(CONSTRUCTION_PARAMS &&... i_construction_params)
        {
            std::lock_guard<std::mutex> lock(m_mutex);
            auto put_transaction = m_queue.template start_reentrant_emplace<ELEMENT_TYPE>(
              std::forward<CONSTRUCTION_PARAMS>(i_construction_params)...);
            return reentrant_put_transaction<ELEMENT_TYPE>(
              PrivateType(), this, std::move(put_transaction));
        }